

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O2

int h264_slice_header(bitstream *str,h264_seqparm **seqparms,h264_picparm **picparms,
                     h264_slice *slice)

{
  h264_picparm *phVar1;
  int iVar2;
  uint32_t in_EAX;
  int iVar3;
  h264_seqparm *phVar4;
  uint32_t uVar5;
  uint uVar6;
  int32_t *piVar7;
  h264_slice *slice_00;
  char *pcVar8;
  size_t sStack_40;
  uint32_t pic_parameter_set_id;
  uint32_t slice_type;
  
  pic_parameter_set_id = in_EAX;
  iVar3 = vs_ue(str,&slice->first_mb_in_slice);
  if (iVar3 != 0) {
    return 1;
  }
  slice_type = slice->slice_all_same * 5 + slice->slice_type;
  iVar3 = vs_ue(str,&slice_type);
  if (iVar3 != 0) {
    return 1;
  }
  slice->slice_type = slice_type % 5;
  slice->slice_all_same = slice_type / 5;
  if (str->dir == VS_ENCODE) {
    pic_parameter_set_id = slice->picparm->pic_parameter_set_id;
  }
  iVar3 = vs_ue(str,&pic_parameter_set_id);
  if (iVar3 != 0) {
    return 1;
  }
  if (str->dir == VS_DECODE) {
    if (0xff < (ulong)pic_parameter_set_id) {
      pcVar8 = "pic_parameter_set_id out of range\n";
      sStack_40 = 0x22;
      goto LAB_00104d43;
    }
    phVar1 = picparms[pic_parameter_set_id];
    slice->picparm = phVar1;
    if (phVar1 == (h264_picparm *)0x0) {
      pcVar8 = "pic_parameter_set_id doesn\'t specify a picparm\n";
    }
    else {
      phVar4 = seqparms[phVar1->seq_parameter_set_id];
      slice->seqparm = phVar4;
      if (phVar4 != (h264_seqparm *)0x0) {
        if (slice->nal_unit_type == 0x13) {
          slice->chroma_array_type = 0;
          slice->bit_depth_luma_minus8 = phVar4->bit_depth_aux_minus8;
          uVar5 = 0;
        }
        else {
          uVar5 = 0;
          if (phVar4->separate_colour_plane_flag == 0) {
            uVar5 = phVar4->chroma_format_idc;
          }
          slice->chroma_array_type = uVar5;
          slice->bit_depth_luma_minus8 = phVar4->bit_depth_luma_minus8;
          uVar5 = phVar4->bit_depth_chroma_minus8;
        }
        slice->bit_depth_chroma_minus8 = uVar5;
        slice->pic_width_in_mbs = phVar4->pic_width_in_mbs_minus1 + 1;
        goto LAB_00104b8f;
      }
      pcVar8 = "seq_parameter_set_id doesn\'t specify a seqparm\n";
    }
    sStack_40 = 0x2f;
    goto LAB_00104d43;
  }
  phVar4 = slice->seqparm;
LAB_00104b8f:
  if (phVar4->separate_colour_plane_flag != 0) {
    iVar3 = vs_u(str,&slice->colour_plane_id,2);
    if (iVar3 != 0) {
      return 1;
    }
    phVar4 = slice->seqparm;
  }
  iVar3 = vs_u(str,&slice->frame_num,phVar4->log2_max_frame_num_minus4 + 4);
  if (iVar3 != 0) {
    return 1;
  }
  if (slice->seqparm->frame_mbs_only_flag == 0) {
    iVar3 = vs_u(str,&slice->field_pic_flag,1);
    if (iVar3 != 0) {
      return 1;
    }
  }
  else {
    iVar3 = vs_infer(str,&slice->field_pic_flag,0);
    if (iVar3 != 0) {
      return 1;
    }
  }
  if (slice->field_pic_flag == 0) {
    iVar3 = vs_infer(str,&slice->bottom_field_flag,0);
    if (iVar3 != 0) {
      return 1;
    }
  }
  else {
    iVar3 = vs_u(str,&slice->bottom_field_flag,1);
    if (iVar3 != 0) {
      return 1;
    }
  }
  phVar4 = slice->seqparm;
  uVar6 = phVar4->pic_height_in_map_units_minus1 + 1;
  slice->pic_height_in_mbs = uVar6;
  if (phVar4->frame_mbs_only_flag == 0) {
    uVar6 = uVar6 * 2;
    slice->pic_height_in_mbs = uVar6;
  }
  if (slice->field_pic_flag != 0) {
    uVar6 = uVar6 >> 1;
    slice->pic_height_in_mbs = uVar6;
  }
  slice->pic_size_in_mbs = uVar6 * slice->pic_width_in_mbs;
  if (str->dir == VS_DECODE) {
    slice->mbaff_frame_flag =
         (uint)(phVar4->mb_adaptive_frame_field_flag != 0 && slice->field_pic_flag == 0);
  }
  if (slice->idr_pic_flag != 0) {
    iVar3 = vs_ue(str,&slice->idr_pic_id);
    if (iVar3 != 0) {
      return 1;
    }
    phVar4 = slice->seqparm;
  }
  if (phVar4->pic_order_cnt_type == 1) {
    if (phVar4->delta_pic_order_always_zero_flag == 0) {
      iVar3 = vs_se(str,slice->delta_pic_order_cnt);
      if (iVar3 != 0) {
        return 1;
      }
      if ((slice->picparm->bottom_field_pic_order_in_frame_present_flag != 0) &&
         (slice->field_pic_flag == 0)) {
        piVar7 = slice->delta_pic_order_cnt + 1;
        goto LAB_00104fa6;
      }
    }
    else {
      iVar3 = vs_infers(str,slice->delta_pic_order_cnt,0);
      if (iVar3 != 0) {
        return 1;
      }
    }
    piVar7 = slice->delta_pic_order_cnt + 1;
LAB_00104d78:
    iVar3 = vs_infers(str,piVar7,0);
LAB_00104d82:
    if (iVar3 != 0) {
      return 1;
    }
  }
  else if (phVar4->pic_order_cnt_type == 0) {
    iVar3 = vs_u(str,&slice->pic_order_cnt_lsb,phVar4->log2_max_pic_order_cnt_lsb_minus4 + 4);
    if (iVar3 != 0) {
      return 1;
    }
    if ((slice->picparm->bottom_field_pic_order_in_frame_present_flag == 0) ||
       (slice->field_pic_flag != 0)) {
      piVar7 = &slice->delta_pic_order_cnt_bottom;
      goto LAB_00104d78;
    }
    piVar7 = &slice->delta_pic_order_cnt_bottom;
LAB_00104fa6:
    iVar3 = vs_se(str,piVar7);
    goto LAB_00104d82;
  }
  if (slice->picparm->redundant_pic_cnt_present_flag == 0) {
    iVar3 = vs_infer(str,&slice->redundant_pic_cnt,0);
  }
  else {
    iVar3 = vs_ue(str,&slice->redundant_pic_cnt);
  }
  if (iVar3 != 0) {
    return 1;
  }
  if ((slice->seqparm->is_svc == 0) || ((slice->svc).quality_id == 0)) {
    uVar5 = slice->slice_type;
    if (uVar5 == 1) {
      iVar3 = vs_u(str,&slice->direct_spatial_mb_pred_flag,1);
      if (iVar3 != 0) {
        return 1;
      }
      uVar5 = slice->slice_type;
    }
    if ((uVar5 != 2) && (uVar5 != 4)) {
      iVar3 = vs_u(str,&slice->num_ref_idx_active_override_flag,1);
      if (iVar3 != 0) {
        return 1;
      }
      slice_00 = (h264_slice *)&slice->num_ref_idx_l0_active_minus1;
      if (slice->num_ref_idx_active_override_flag == 0) {
        iVar3 = vs_infer(str,(uint32_t *)slice_00,
                         slice->picparm->num_ref_idx_l0_default_active_minus1);
        if (iVar3 != 0) {
          return 1;
        }
        if (slice->slice_type == 1) {
          slice_00 = (h264_slice *)&slice->num_ref_idx_l1_active_minus1;
          iVar3 = vs_infer(str,(uint32_t *)slice_00,
                           slice->picparm->num_ref_idx_l1_default_active_minus1);
          goto LAB_001051e4;
        }
      }
      else {
        iVar3 = vs_ue(str,(uint32_t *)slice_00);
        if (iVar3 != 0) {
          return 1;
        }
        if (slice->slice_type == 1) {
          slice_00 = (h264_slice *)&slice->num_ref_idx_l1_active_minus1;
          iVar3 = vs_ue(str,(uint32_t *)slice_00);
LAB_001051e4:
          if (iVar3 != 0) {
            return 1;
          }
        }
      }
      if (0x1f < slice->num_ref_idx_l0_active_minus1) {
        pcVar8 = "num_ref_idx_l0_active_minus1 out of range\n";
LAB_00105271:
        fwrite(pcVar8,0x2a,1,_stderr);
        return 1;
      }
      if (0x1f < slice->num_ref_idx_l1_active_minus1) {
        pcVar8 = "num_ref_idx_l1_active_minus1 out of range\n";
        goto LAB_00105271;
      }
      iVar3 = h264_ref_pic_list_modification(str,slice_00,&slice->ref_pic_list_modification_l0);
      if (iVar3 != 0) {
        return 1;
      }
      if ((slice->slice_type == 1) &&
         (iVar3 = h264_ref_pic_list_modification(str,slice_00,&slice->ref_pic_list_modification_l1),
         iVar3 != 0)) {
        return 1;
      }
    }
    if (((slice->picparm->weighted_pred_flag != 0) &&
        ((slice->slice_type == 0 || (slice->slice_type == 3)))) ||
       ((slice->picparm->weighted_bipred_idc == 1 && (slice->slice_type == 1)))) {
      if ((slice->seqparm->is_svc == 0) || ((slice->svc).no_inter_layer_pred_flag != 0)) {
        iVar3 = vs_infer(str,&slice->base_pred_weight_table_flag,0);
        if (iVar3 != 0) {
          return 1;
        }
      }
      else {
        iVar3 = vs_u(str,&slice->base_pred_weight_table_flag,1);
        if (iVar3 != 0) {
          return 1;
        }
      }
      if ((slice->base_pred_weight_table_flag == 0) &&
         (iVar3 = h264_pred_weight_table(str,slice,&slice->pred_weight_table), iVar3 != 0)) {
        return 1;
      }
    }
    if (slice->nal_ref_idc != 0) {
      iVar3 = h264_dec_ref_pic_marking(str,slice->idr_pic_flag,&slice->dec_ref_pic_marking);
      if (iVar3 != 0) {
        return 1;
      }
      if (((slice->seqparm->is_svc != 0) && (slice->seqparm->slice_header_restriction_flag == 0)) &&
         (iVar3 = h264_dec_ref_base_pic_marking(str,&slice->svc,&slice->dec_ref_base_pic_marking),
         iVar3 != 0)) {
        return 1;
      }
    }
  }
  if (((slice->picparm->entropy_coding_mode_flag != 0) && (slice->slice_type != 2)) &&
     (slice->slice_type != 4)) {
    iVar3 = vs_ue(str,&slice->cabac_init_idc);
    if (iVar3 != 0) {
      return 1;
    }
    if (2 < slice->cabac_init_idc) {
      pcVar8 = "cabac_init_idc out of range!\n";
      sStack_40 = 0x1d;
      goto LAB_00104d43;
    }
  }
  iVar3 = vs_se(str,&slice->slice_qp_delta);
  if (iVar3 != 0) {
    return 1;
  }
  slice->sliceqpy = slice->picparm->pic_init_qp_minus26 + slice->slice_qp_delta + 0x1a;
  uVar5 = slice->slice_type;
  if (uVar5 == 3) {
    iVar3 = vs_u(str,&slice->sp_for_switch_flag,1);
    if (iVar3 != 0) {
      return 1;
    }
    uVar5 = slice->slice_type;
  }
  if ((uVar5 - 3 < 2) && (iVar3 = vs_se(str,&slice->slice_qs_delta), iVar3 != 0)) {
    return 1;
  }
  if (slice->picparm->deblocking_filter_control_present_flag == 0) {
    iVar3 = vs_infer(str,&slice->disable_deblocking_filter_idc,0);
    if (iVar3 != 0) {
      return 1;
    }
LAB_001050ab:
    iVar3 = vs_infers(str,&slice->slice_alpha_c0_offset_div2,0);
    if (iVar3 != 0) {
      return 1;
    }
    iVar3 = vs_infers(str,&slice->slice_beta_offset_div2,0);
  }
  else {
    iVar3 = vs_ue(str,&slice->disable_deblocking_filter_idc);
    if (iVar3 != 0) {
      return 1;
    }
    if (slice->disable_deblocking_filter_idc == 1) goto LAB_001050ab;
    iVar3 = vs_se(str,&slice->slice_alpha_c0_offset_div2);
    if (iVar3 != 0) {
      return 1;
    }
    iVar3 = vs_se(str,&slice->slice_beta_offset_div2);
  }
  if (iVar3 != 0) {
    return 1;
  }
  phVar1 = slice->picparm;
  if (phVar1->num_slice_groups_minus1 != 0) {
    if (phVar1->slice_group_map_type - 3 < 3) {
      iVar3 = 0;
      uVar6 = ((slice->seqparm->pic_height_in_map_units_minus1 + 1) *
               (slice->seqparm->pic_width_in_mbs_minus1 + 1) +
              phVar1->slice_group_change_rate_minus1) / (phVar1->slice_group_change_rate_minus1 + 1)
              + 1;
      if (uVar6 != 0) {
        iVar2 = 0;
        do {
          iVar3 = iVar2;
          iVar2 = iVar3 + 1;
        } while (-(ulong)uVar6 < (ulong)(-1L << ((byte)iVar3 & 0x3f)));
      }
      iVar3 = vs_u(str,&slice->slice_group_change_cycle,iVar3);
      if (iVar3 != 0) {
        return 1;
      }
      if (slice->picparm->num_slice_groups_minus1 == 0) goto LAB_00105164;
    }
    iVar3 = h264_prep_sgmap(slice);
    if (iVar3 != 0) {
      return 1;
    }
  }
LAB_00105164:
  if (slice->seqparm->is_svc == 0) {
    return 0;
  }
  pcVar8 = "SVC\n";
  sStack_40 = 4;
LAB_00104d43:
  fwrite(pcVar8,sStack_40,1,_stderr);
  return 1;
}

Assistant:

int h264_slice_header(struct bitstream *str, struct h264_seqparm **seqparms, struct h264_picparm **picparms, struct h264_slice *slice) {
	if (vs_ue(str, &slice->first_mb_in_slice)) return 1;
	uint32_t slice_type = slice->slice_type + slice->slice_all_same * 5;
	if (vs_ue(str, &slice_type)) return 1;
	slice->slice_type = slice_type % 5;
	slice->slice_all_same = slice_type / 5;
	uint32_t pic_parameter_set_id;
	if (str->dir == VS_ENCODE)
		pic_parameter_set_id = slice->picparm->pic_parameter_set_id;
	if (vs_ue(str, &pic_parameter_set_id)) return 1;
	if (str->dir == VS_DECODE) {
		if (pic_parameter_set_id > 255) {
			fprintf(stderr, "pic_parameter_set_id out of range\n");
			return 1;
		}
		slice->picparm = picparms[pic_parameter_set_id];
		if (!slice->picparm) {
			fprintf(stderr, "pic_parameter_set_id doesn't specify a picparm\n");
			return 1;
		}
		slice->seqparm = seqparms[slice->picparm->seq_parameter_set_id];
		if (!slice->seqparm) {
			fprintf(stderr, "seq_parameter_set_id doesn't specify a seqparm\n");
			return 1;
		}
		if (slice->nal_unit_type == H264_NAL_UNIT_TYPE_SLICE_AUX) {
			slice->chroma_array_type = 0;
			slice->bit_depth_luma_minus8 = slice->seqparm->bit_depth_aux_minus8;
			slice->bit_depth_chroma_minus8 = 0;
		} else {
			slice->chroma_array_type = (slice->seqparm->separate_colour_plane_flag?0:slice->seqparm->chroma_format_idc);
			slice->bit_depth_luma_minus8 = slice->seqparm->bit_depth_luma_minus8;
			slice->bit_depth_chroma_minus8 = slice->seqparm->bit_depth_chroma_minus8;
		}
		slice->pic_width_in_mbs = slice->seqparm->pic_width_in_mbs_minus1 + 1;
	}
	if (slice->seqparm->separate_colour_plane_flag)
		if (vs_u(str, &slice->colour_plane_id, 2)) return 1;
	if (vs_u(str, &slice->frame_num, slice->seqparm->log2_max_frame_num_minus4 + 4)) return 1;
	if (!slice->seqparm->frame_mbs_only_flag) {
		if (vs_u(str, &slice->field_pic_flag, 1)) return 1;
	} else {
		if (vs_infer(str, &slice->field_pic_flag, 0)) return 1;
	}
	if (slice->field_pic_flag) {
		if (vs_u(str, &slice->bottom_field_flag, 1)) return 1;
	} else {
		if (vs_infer(str, &slice->bottom_field_flag, 0)) return 1;
	}
	slice->pic_height_in_mbs = (slice->seqparm->pic_height_in_map_units_minus1 + 1);
	if (!slice->seqparm->frame_mbs_only_flag)
		slice->pic_height_in_mbs *= 2;
	if (slice->field_pic_flag)
		slice->pic_height_in_mbs /= 2;
	slice->pic_size_in_mbs = slice->pic_width_in_mbs * slice->pic_height_in_mbs;
	if (str->dir == VS_DECODE) {
		slice->mbaff_frame_flag = slice->seqparm->mb_adaptive_frame_field_flag && !slice->field_pic_flag;
	}
	if (slice->idr_pic_flag) {
		if (vs_ue(str, &slice->idr_pic_id)) return 1;
	}
	switch (slice->seqparm->pic_order_cnt_type) {
		case 0:
			if (vs_u(str, &slice->pic_order_cnt_lsb, slice->seqparm->log2_max_pic_order_cnt_lsb_minus4 + 4)) return 1;
			if (slice->picparm->bottom_field_pic_order_in_frame_present_flag && !slice->field_pic_flag) {
				if (vs_se(str, &slice->delta_pic_order_cnt_bottom)) return 1;
			} else {
				if (vs_infers(str, &slice->delta_pic_order_cnt_bottom, 0)) return 1;
			}
			break;
		case 1:
			if (!slice->seqparm->delta_pic_order_always_zero_flag) {
				if (vs_se(str, &slice->delta_pic_order_cnt[0])) return 1;
				if (slice->picparm->bottom_field_pic_order_in_frame_present_flag && !slice->field_pic_flag) {
					if (vs_se(str, &slice->delta_pic_order_cnt[1])) return 1;
				} else {
					if (vs_infers(str, &slice->delta_pic_order_cnt[1], 0)) return 1;
				}
			} else {
				if (vs_infers(str, &slice->delta_pic_order_cnt[0], 0)) return 1;
				if (vs_infers(str, &slice->delta_pic_order_cnt[1], 0)) return 1;
			}
			break;
	}
	if (slice->picparm->redundant_pic_cnt_present_flag) {
		if (vs_ue(str, &slice->redundant_pic_cnt)) return 1;
	} else {
		if (vs_infer(str, &slice->redundant_pic_cnt, 0)) return 1;
	}
	if (!slice->seqparm->is_svc || slice->svc.quality_id == 0) {
		if (slice->slice_type == H264_SLICE_TYPE_B)
			if (vs_u(str, &slice->direct_spatial_mb_pred_flag, 1)) return 1;
		if (slice->slice_type != H264_SLICE_TYPE_I && slice->slice_type != H264_SLICE_TYPE_SI) {
			if (vs_u(str, &slice->num_ref_idx_active_override_flag, 1)) return 1;
			if (slice->num_ref_idx_active_override_flag) {
				if (vs_ue(str, &slice->num_ref_idx_l0_active_minus1)) return 1;
				if (slice->slice_type == H264_SLICE_TYPE_B)
					if (vs_ue(str, &slice->num_ref_idx_l1_active_minus1)) return 1;
			} else {
				if (vs_infer(str, &slice->num_ref_idx_l0_active_minus1, slice->picparm->num_ref_idx_l0_default_active_minus1)) return 1;
				if (slice->slice_type == H264_SLICE_TYPE_B)
					if (vs_infer(str, &slice->num_ref_idx_l1_active_minus1, slice->picparm->num_ref_idx_l1_default_active_minus1)) return 1;

			}
			if (slice->num_ref_idx_l0_active_minus1 > 31) {
				fprintf(stderr, "num_ref_idx_l0_active_minus1 out of range\n");
				return 1;
			}
			if (slice->num_ref_idx_l1_active_minus1 > 31) {
				fprintf(stderr, "num_ref_idx_l1_active_minus1 out of range\n");
				return 1;
			}
			/* ref_pic_list_modification */
			if (h264_ref_pic_list_modification(str, slice, &slice->ref_pic_list_modification_l0)) return 1;
			if (slice->slice_type == H264_SLICE_TYPE_B) {
				if (h264_ref_pic_list_modification(str, slice, &slice->ref_pic_list_modification_l1)) return 1;
			}
		}
		if ((slice->picparm->weighted_pred_flag && (slice->slice_type == H264_SLICE_TYPE_P || slice->slice_type == H264_SLICE_TYPE_SP)) || (slice->picparm->weighted_bipred_idc == 1 && slice->slice_type == H264_SLICE_TYPE_B)) {
			if (slice->seqparm->is_svc && !slice->svc.no_inter_layer_pred_flag) {
				if (vs_u(str, &slice->base_pred_weight_table_flag, 1)) return 1;
			} else {
				if (vs_infer(str, &slice->base_pred_weight_table_flag, 0)) return 1;
			}
			if (!slice->base_pred_weight_table_flag)
				if (h264_pred_weight_table(str, slice, &slice->pred_weight_table)) return 1;
		}
		if (slice->nal_ref_idc) {
			if (h264_dec_ref_pic_marking(str, slice->idr_pic_flag, &slice->dec_ref_pic_marking)) return 1;
			if (slice->seqparm->is_svc && !slice->seqparm->slice_header_restriction_flag) {
				if (h264_dec_ref_base_pic_marking(str, &slice->svc, &slice->dec_ref_base_pic_marking)) return 1;
			}
		}
	} else {
		/* XXX: infer me */
	}
	if (slice->picparm->entropy_coding_mode_flag && slice->slice_type != H264_SLICE_TYPE_I && slice->slice_type != H264_SLICE_TYPE_SI) {
		if (vs_ue(str, &slice->cabac_init_idc)) return 1;
		if (slice->cabac_init_idc > 2) {
			fprintf(stderr, "cabac_init_idc out of range!\n");
			return 1;
		}
	}
	if (vs_se(str, &slice->slice_qp_delta)) return 1;
	slice->sliceqpy = slice->picparm->pic_init_qp_minus26 + 26 + slice->slice_qp_delta;
	if (slice->slice_type == H264_SLICE_TYPE_SP)
		if (vs_u(str, &slice->sp_for_switch_flag, 1)) return 1;
	if (slice->slice_type == H264_SLICE_TYPE_SP || slice->slice_type == H264_SLICE_TYPE_SI)
		if (vs_se(str, &slice->slice_qs_delta)) return 1;
	if (slice->picparm->deblocking_filter_control_present_flag) {
		if (vs_ue(str, &slice->disable_deblocking_filter_idc)) return 1;
		if (slice->disable_deblocking_filter_idc != 1) {
			if (vs_se(str, &slice->slice_alpha_c0_offset_div2)) return 1;
			if (vs_se(str, &slice->slice_beta_offset_div2)) return 1;
		} else {
			if (vs_infers(str, &slice->slice_alpha_c0_offset_div2, 0)) return 1;
			if (vs_infers(str, &slice->slice_beta_offset_div2, 0)) return 1;
		}
	} else {
		if (vs_infer(str, &slice->disable_deblocking_filter_idc, 0)) return 1;
		if (vs_infers(str, &slice->slice_alpha_c0_offset_div2, 0)) return 1;
		if (vs_infers(str, &slice->slice_beta_offset_div2, 0)) return 1;
	}
	if (slice->picparm->num_slice_groups_minus1 && slice->picparm->slice_group_map_type >= 3 && slice->picparm->slice_group_map_type <= 5)
		if (vs_u(str, &slice->slice_group_change_cycle, clog2(((slice->seqparm->pic_width_in_mbs_minus1 + 1) * (slice->seqparm->pic_height_in_map_units_minus1 + 1) + slice->picparm->slice_group_change_rate_minus1) / (slice->picparm->slice_group_change_rate_minus1 + 1) + 1))) return 1;
	if (slice->picparm->num_slice_groups_minus1)
		if (h264_prep_sgmap(slice)) return 1;
	if (slice->seqparm->is_svc) {
		/* XXX */
		fprintf(stderr, "SVC\n");
		return 1;
	}
	return 0;
}